

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O3

void __thiscall TWeightedList<FDecalBase_*>::RecalcRandomVals(TWeightedList<FDecalBase_*> *this)

{
  ushort uVar1;
  Choice<FDecalBase_*> **ppCVar2;
  Choice<FDecalBase_*> *pCVar3;
  Choice<FDecalBase_*> *pCVar4;
  int iVar5;
  Choice<FDecalBase_*> *pCVar6;
  Choice<FDecalBase_*> *pCVar7;
  Choice<FDecalBase_*> *pCVar8;
  double dVar9;
  
  pCVar4 = this->Choices;
  if (pCVar4 != (Choice<FDecalBase_*> *)0x0) {
    pCVar6 = pCVar4->Next;
    if (pCVar6 == (Choice<FDecalBase_*> *)0x0) {
      pCVar4->RandomVal = 0xff;
      return;
    }
    iVar5 = 0;
    pCVar7 = pCVar4;
    pCVar3 = pCVar6;
    do {
      pCVar8 = pCVar3;
      iVar5 = iVar5 + (uint)pCVar7->Weight;
      pCVar7 = pCVar8;
      pCVar3 = pCVar8->Next;
    } while (pCVar8->Next != (Choice<FDecalBase_*> *)0x0);
    uVar1 = pCVar8->Weight;
    pCVar8->RandomVal = 0xff;
    if (pCVar6 != (Choice<FDecalBase_*> *)0x0) {
      dVar9 = 0.0;
      pCVar6 = pCVar4->Next;
      do {
        dVar9 = dVar9 + (double)pCVar4->Weight * (1.0 / (double)(int)(iVar5 + (uint)uVar1));
        pCVar4->RandomVal = (BYTE)(int)(dVar9 * 255.0);
        ppCVar2 = &pCVar6->Next;
        pCVar4 = pCVar6;
        pCVar6 = *ppCVar2;
      } while (*ppCVar2 != (Choice<FDecalBase_*> *)0x0);
    }
  }
  return;
}

Assistant:

void TWeightedList<T>::RecalcRandomVals ()
{
	// Redistribute the RandomVals so that they form the correct
	// distribution (as determined by the range of weights).

	int numChoices, weightSums;
	Choice<T> *choice;
	double randVal, weightDenom;

	if (Choices == NULL)
	{ // No choices, so nothing to do.
		return;
	}

	numChoices = 1;
	weightSums = 0;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		++numChoices;
		weightSums += choice->Weight;
	}

	weightSums += choice->Weight;
	choice->RandomVal = 255;	// The last choice is always randomval 255

	randVal = 0.0;
	weightDenom = 1.0 / (double)weightSums;

	for (choice = Choices; choice->Next != NULL; choice = choice->Next)
	{
		randVal += (double)choice->Weight * weightDenom;
		choice->RandomVal = (BYTE)(randVal * 255.0);
	}
}